

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtils.hpp
# Opt level: O2

void OpenMD::Utils::details::lifted_deleter<OpenMD::ConstraintElem*>(ConstraintElem *val)

{
  if (val != (ConstraintElem *)0x0) {
    ConstraintElem::~ConstraintElem(val);
  }
  operator_delete(val,0x28);
  return;
}

Assistant:

void lifted_deleter(T val) {
      delete val;
    }